

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.h
# Opt level: O2

int cgltf_parse_json_int_array(jsmntok_t *tokens,int i,uint8_t *json_chunk,int *out_array,int size)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  iVar1 = -1;
  if ((tokens[i].type == JSMN_ARRAY) && (tokens[i].size == size)) {
    uVar3 = 0;
    uVar4 = (ulong)(uint)size;
    if (size < 1) {
      uVar4 = uVar3;
    }
    for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      uVar2 = (i + 1) + uVar3 & 0xffffffff;
      if (tokens[uVar2].type != JSMN_PRIMITIVE) {
        return -1;
      }
      iVar1 = cgltf_json_to_int(tokens + uVar2,json_chunk);
      out_array[uVar3] = iVar1;
    }
    iVar1 = i + (int)uVar3 + 1;
  }
  return iVar1;
}

Assistant:

static int cgltf_parse_json_int_array(jsmntok_t const* tokens, int i, const uint8_t* json_chunk, int* out_array, int size)
{
	CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_ARRAY);
	if (tokens[i].size != size)
	{
		return CGLTF_ERROR_JSON;
	}
	++i;
	for (int j = 0; j < size; ++j)
	{
		CGLTF_CHECK_TOKTYPE(tokens[i], JSMN_PRIMITIVE);
		out_array[j] = cgltf_json_to_int(tokens + i, json_chunk);
		++i;
	}
	return i;
}